

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O1

void pztopology::TPZTetrahedron::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  uint uVar1;
  Fad<double> *pFVar2;
  long lVar3;
  ulong uVar4;
  Fad<double> eta;
  Fad<double> zeta;
  Fad<double> qsi;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> local_c8;
  Fad<double> local_a8;
  Fad<double> local_88;
  Fad<double> local_68;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
  local_48;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  local_38;
  
  pFVar2 = loc->fStore;
  local_68.val_ = pFVar2->val_;
  uVar1 = (pFVar2->dx_).num_elts;
  local_68.dx_.ptr_to_data = (double *)0x0;
  local_68.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar4 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar4 = (long)(int)uVar1 << 3;
    }
    local_68.dx_.ptr_to_data = (double *)operator_new__(uVar4);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_68.dx_.ptr_to_data,(EVP_PKEY_CTX *)(pFVar2->dx_).ptr_to_data
               ,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_68.defaultVal = pFVar2->defaultVal;
  pFVar2 = loc->fStore;
  local_a8.val_ = pFVar2[1].val_;
  uVar1 = pFVar2[1].dx_.num_elts;
  local_a8.dx_.ptr_to_data = (double *)0x0;
  local_a8.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar4 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar4 = (long)(int)uVar1 * 8;
    }
    local_a8.dx_.ptr_to_data = (double *)operator_new__(uVar4);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_a8.dx_.ptr_to_data,(EVP_PKEY_CTX *)pFVar2[1].dx_.ptr_to_data
               ,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_a8.defaultVal = pFVar2[1].defaultVal;
  pFVar2 = loc->fStore;
  local_88.val_ = pFVar2[2].val_;
  uVar1 = pFVar2[2].dx_.num_elts;
  local_88.dx_.ptr_to_data = (double *)0x0;
  local_88.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar4 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar4 = (long)(int)uVar1 * 8;
    }
    local_88.dx_.ptr_to_data = (double *)operator_new__(uVar4);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_88.dx_.ptr_to_data,(EVP_PKEY_CTX *)pFVar2[2].dx_.ptr_to_data
               ,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_88.defaultVal = pFVar2[2].defaultVal;
  local_48.fadexpr_.right_ = &local_88;
  local_c8.fadexpr_.left_.constant_ = 1.0;
  local_c8.fadexpr_.left_.defaultVal = 0.0;
  local_c8.fadexpr_.right_ = &local_68;
  local_48.fadexpr_.left_ = &local_38;
  local_38.fadexpr_.right_ = &local_a8;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_38.fadexpr_.left_ = &local_c8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_38.fadexpr_.left_ = &local_c8;
  Fad<double>::operator=(phi->fElem,&local_48);
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar2 = phi->fElem;
  pFVar2[1].val_ = local_68.val_;
  Vector<double>::operator=(&pFVar2[1].dx_,&local_68.dx_);
  pFVar2[1].defaultVal = local_68.defaultVal;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar2 = phi->fElem;
  pFVar2[2].val_ = local_a8.val_;
  Vector<double>::operator=(&pFVar2[2].dx_,&local_a8.dx_);
  pFVar2[2].defaultVal = local_a8.defaultVal;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 4) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar2 = phi->fElem;
  pFVar2[3].val_ = local_88.val_;
  Vector<double>::operator=(&pFVar2[3].dx_,&local_88.dx_);
  pFVar2[3].defaultVal = local_88.defaultVal;
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar2 = dphi->fElem;
  pFVar2->val_ = -1.0;
  if ((pFVar2->dx_).num_elts != 0) {
    local_c8._0_8_ = 0;
    Vector<double>::operator=(&pFVar2->dx_,(double *)&local_c8);
  }
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar2 = dphi->fElem;
  pFVar2[1].val_ = -1.0;
  if (pFVar2[1].dx_.num_elts != 0) {
    local_c8._0_8_ = 0;
    Vector<double>::operator=(&pFVar2[1].dx_,(double *)&local_c8);
  }
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar2 = dphi->fElem;
  pFVar2[2].val_ = -1.0;
  if (pFVar2[2].dx_.num_elts != 0) {
    local_c8._0_8_ = 0;
    Vector<double>::operator=(&pFVar2[2].dx_,(double *)&local_c8);
  }
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  pFVar2 = dphi->fElem;
  pFVar2[lVar3].val_ = 1.0;
  if (pFVar2[lVar3].dx_.num_elts != 0) {
    local_c8._0_8_ = 0;
    Vector<double>::operator=(&pFVar2[lVar3].dx_,(double *)&local_c8);
  }
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  pFVar2 = dphi->fElem;
  pFVar2[lVar3 + 1].val_ = 0.0;
  if (pFVar2[lVar3 + 1].dx_.num_elts != 0) {
    local_c8._0_8_ = 0;
    Vector<double>::operator=(&pFVar2[lVar3 + 1].dx_,(double *)&local_c8);
  }
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  pFVar2 = dphi->fElem;
  pFVar2[lVar3 + 2].val_ = 0.0;
  if (pFVar2[lVar3 + 2].dx_.num_elts != 0) {
    local_c8._0_8_ = 0;
    Vector<double>::operator=(&pFVar2[lVar3 + 2].dx_,(double *)&local_c8);
  }
  if ((0 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow) &&
     (2 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
    lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar3 * 2].val_ = 0.0;
    if (pFVar2[lVar3 * 2].dx_.num_elts != 0) {
      local_c8._0_8_ = 0;
      Vector<double>::operator=(&pFVar2[lVar3 * 2].dx_,(double *)&local_c8);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar3 * 2 + 1].val_ = 1.0;
    if (pFVar2[lVar3 * 2 + 1].dx_.num_elts != 0) {
      local_c8._0_8_ = 0;
      Vector<double>::operator=(&pFVar2[lVar3 * 2 + 1].dx_,(double *)&local_c8);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar3 * 2 + 2].val_ = 0.0;
    if (pFVar2[lVar3 * 2 + 2].dx_.num_elts != 0) {
      local_c8._0_8_ = 0;
      Vector<double>::operator=(&pFVar2[lVar3 * 2 + 2].dx_,(double *)&local_c8);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar3 * 3].val_ = 0.0;
    if (pFVar2[lVar3 * 3].dx_.num_elts != 0) {
      local_c8._0_8_ = 0;
      Vector<double>::operator=(&pFVar2[lVar3 * 3].dx_,(double *)&local_c8);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar3 * 3 + 1].val_ = 0.0;
    if (pFVar2[lVar3 * 3 + 1].dx_.num_elts != 0) {
      local_c8._0_8_ = 0;
      Vector<double>::operator=(&pFVar2[lVar3 * 3 + 1].dx_,(double *)&local_c8);
    }
    if ((2 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow) &&
       (3 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
      lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      pFVar2 = dphi->fElem;
      pFVar2[lVar3 * 3 + 2].val_ = 1.0;
      if (pFVar2[lVar3 * 3 + 2].dx_.num_elts != 0) {
        local_c8._0_8_ = 0;
        Vector<double>::operator=(&pFVar2[lVar3 * 3 + 2].dx_,(double *)&local_c8);
      }
      if ((MEM_CPY<double> *)local_88.dx_.ptr_to_data != (MEM_CPY<double> *)0x0) {
        operator_delete__(local_88.dx_.ptr_to_data);
      }
      if ((MEM_CPY<double> *)local_a8.dx_.ptr_to_data != (MEM_CPY<double> *)0x0) {
        operator_delete__(local_a8.dx_.ptr_to_data);
      }
      if ((MEM_CPY<double> *)local_68.dx_.ptr_to_data != (MEM_CPY<double> *)0x0) {
        operator_delete__(local_68.dx_.ptr_to_data);
      }
      return;
    }
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

inline void TPZTetrahedron::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T qsi = loc[0], eta = loc[1] , zeta  = loc[2];

        phi(0,0)  = 1.0-qsi-eta-zeta;
        phi(1,0)  = qsi;
        phi(2,0)  = eta;
        phi(3,0)  = zeta;

        dphi(0,0) = -1.0;
        dphi(1,0) = -1.0;
        dphi(2,0) = -1.0;
        dphi(0,1) =  1.0;
        dphi(1,1) =  0.0;
        dphi(2,1) =  0.0;
        dphi(0,2) =  0.0;
        dphi(1,2) =  1.0;
        dphi(2,2) =  0.0;
        dphi(0,3) =  0.0;
        dphi(1,3) =  0.0;
        dphi(2,3) =  1.0;

    }